

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTriangles.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderTrianglesInnerTessellationLevelRounding::runTestIterations
          (TessellationShaderTrianglesInnerTessellationLevelRounding *this)

{
  float vertex_spacing;
  int iVar1;
  GLenum err;
  NotSupportedError *this_00;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TessellationShaderUtils *this_01;
  TestLog *pTVar3;
  MessageBuilder *pMVar4;
  TestError *pTVar5;
  _tessellation_shader_vertex_spacing vertex_spacing_00;
  vector<char,_std::allocator<char>_> local_610;
  vector<char,_std::allocator<char>_> local_5f8;
  MessageBuilder local_5e0;
  undefined1 local_460 [8];
  string vs_mode_string_2;
  undefined1 local_2c0 [8];
  string vs_mode_string_1;
  undefined1 local_120 [8];
  string vs_mode_string;
  GLint n_set2_vertices;
  GLint n_set1_vertices;
  _run run;
  uint local_80;
  GLint tess_level;
  uint n_tess_level;
  _tessellation_shader_vertex_spacing vs_mode;
  uint n_vs_mode;
  uint n_vs_modes;
  _tessellation_shader_vertex_spacing vs_modes [3];
  uint n_tess_levels;
  GLint tess_levels [3];
  GLint gl_max_tess_gen_level_value;
  Functions *gl;
  allocator<char> local_31;
  string local_30;
  TessellationShaderTrianglesInnerTessellationLevelRounding *local_10;
  TessellationShaderTrianglesInnerTessellationLevelRounding *this_local;
  
  local_10 = this;
  if (((this->super_TestCaseBase).m_is_tessellation_shader_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Tessellation shader functionality not supported, skipping",
               &local_31);
    tcu::NotSupportedError::NotSupportedError(this_00,&local_30);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  register0x00000000 = (Functions *)CONCAT44(extraout_var,iVar1);
  this_01 = (TessellationShaderUtils *)operator_new(0x20);
  TessellationShaderUtils::TessellationShaderUtils
            (this_01,stack0xffffffffffffffb0,&this->super_TestCaseBase);
  this->m_utils = this_01;
  tess_levels[1] = 0;
  (*stack0xffffffffffffffb0->getIntegerv)
            ((this->super_TestCaseBase).m_glExtTokens.MAX_TESS_GEN_LEVEL,tess_levels + 1);
  err = (*stack0xffffffffffffffb0->getError)();
  glu::checkError(err,"glGetIntegerv() call failed for GL_MAX_TESS_GEN_LEVEL_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTriangles.cpp"
                  ,0x3ad);
  vs_modes[2] = TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD;
  tess_levels[0] = tess_levels[1];
  vs_modes[1] = TESSELLATION_SHADER_VERTEX_SPACING_DEFAULT;
  _n_vs_mode = 0x100000000;
  vs_modes[0] = TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD;
  n_tess_level = 0;
  do {
    if (2 < n_tess_level) {
      return;
    }
    vertex_spacing = (float)(&n_vs_mode)[n_tess_level];
    for (local_80 = 0; local_80 < 3; local_80 = local_80 + 1) {
      run._108_4_ = vs_modes[(ulong)local_80 + 2];
      _run::_run((_run *)&n_set2_vertices);
      n_set2_vertices = 0x3f800000;
      n_set1_vertices = 0;
      run.set1_outer[3] = 0.0;
      TessellationShaderUtils::getTessellationLevelAfterVertexSpacing
                ((_tessellation_shader_vertex_spacing)vertex_spacing,1.5,tess_levels[1],(float *)0x0
                 ,run.set1_outer + 2);
      run.set1_inner[0] = (float)(int)run._108_4_;
      run.set2_inner[0] = (float)(int)run._108_4_;
      run.set1_inner[1] = (float)(int)run._108_4_;
      run.set2_inner[1] = (float)(int)run._108_4_;
      run.set1_outer[0] = (float)(int)run._108_4_;
      run.set2_outer[0] = (float)(int)run._108_4_;
      run.set1_outer[1] = (float)(int)run._108_4_;
      run.set2_outer[1] = (float)(int)run._108_4_;
      vs_mode_string.field_2._12_4_ = 0;
      vs_mode_string.field_2._8_4_ = 0;
      run.set2_outer[2] = vertex_spacing;
      vs_mode_string.field_2._12_4_ =
           TessellationShaderUtils::getAmountOfVerticesGeneratedByTessellator
                     (this->m_utils,TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES,
                      (float *)&n_set2_vertices,run.set1_inner,
                      (_tessellation_shader_vertex_spacing)vertex_spacing,false);
      vs_mode_string.field_2._8_4_ =
           TessellationShaderUtils::getAmountOfVerticesGeneratedByTessellator
                     (this->m_utils,TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES,run.set1_outer + 2,
                      run.set2_inner,(_tessellation_shader_vertex_spacing)run.set2_outer[2],false);
      if (vs_mode_string.field_2._12_4_ == 0) {
        TessellationShaderUtils::getESTokenForVertexSpacingMode_abi_cxx11_
                  ((string *)local_120,(TessellationShaderUtils *)(ulong)(uint)vertex_spacing,
                   vertex_spacing_00);
        pTVar3 = tcu::TestContext::getLog
                           ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)((long)&vs_mode_string_1.field_2 + 8),pTVar3,
                   (BeginMessageToken *)&tcu::TestLog::Message);
        pMVar4 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)((long)&vs_mode_string_1.field_2 + 8),
                            (char (*) [67])
                            "No vertices were generated by tessellator for: inner tess levels:[");
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(float *)&n_set2_vertices);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a4b1eb);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(float *)&n_set1_vertices);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [23])"], outer tess levels:[");
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,run.set1_inner);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a4b1eb);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,run.set1_inner + 1);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a4b1eb);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,run.set1_outer);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a4b1eb);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,run.set1_outer + 1);
        pMVar4 = tcu::MessageBuilder::operator<<
                           (pMVar4,(char (*) [47])"], primitive mode: triangles, vertex spacing: ");
        pMVar4 = tcu::MessageBuilder::operator<<
                           (pMVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_120);
        tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder
                  ((MessageBuilder *)((long)&vs_mode_string_1.field_2 + 8));
        pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar5,"Zero vertices were generated by tessellator for first test pass",
                   (char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTriangles.cpp"
                   ,0x3ef);
        __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      if (vs_mode_string.field_2._8_4_ == 0) {
        TessellationShaderUtils::getESTokenForVertexSpacingMode_abi_cxx11_
                  ((string *)local_2c0,(TessellationShaderUtils *)(ulong)(uint)vertex_spacing,
                   vertex_spacing_00);
        pTVar3 = tcu::TestContext::getLog
                           ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)((long)&vs_mode_string_2.field_2 + 8),pTVar3,
                   (BeginMessageToken *)&tcu::TestLog::Message);
        pMVar4 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)((long)&vs_mode_string_2.field_2 + 8),
                            (char (*) [67])
                            "No vertices were generated by tessellator for: inner tess levels:[");
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,run.set1_outer + 2);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a4b1eb);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,run.set1_outer + 3);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [23])"], outer tess levels:[");
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,run.set2_inner);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a4b1eb);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,run.set2_inner + 1);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a4b1eb);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,run.set2_outer);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a4b1eb);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,run.set2_outer + 1);
        pMVar4 = tcu::MessageBuilder::operator<<
                           (pMVar4,(char (*) [47])"], primitive mode: triangles, vertex spacing: ");
        pMVar4 = tcu::MessageBuilder::operator<<
                           (pMVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_2c0);
        tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder
                  ((MessageBuilder *)((long)&vs_mode_string_2.field_2 + 8));
        pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar5,"Zero vertices were generated by tessellator for second test pass",
                   (char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTriangles.cpp"
                   ,0x402);
        __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      if (vs_mode_string.field_2._12_4_ != vs_mode_string.field_2._8_4_) {
        TessellationShaderUtils::getESTokenForVertexSpacingMode_abi_cxx11_
                  ((string *)local_460,(TessellationShaderUtils *)(ulong)(uint)vertex_spacing,
                   vertex_spacing_00);
        pTVar3 = tcu::TestContext::getLog
                           ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_5e0,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar4 = tcu::MessageBuilder::operator<<
                           (&local_5e0,
                            (char (*) [115])
                            "Amount of vertices generated by the tessellator differs for the following inner/outer configs: inner tess levels:["
                           );
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(float *)&n_set2_vertices);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a4b1eb);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(float *)&n_set1_vertices);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [23])"], outer tess levels:[");
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,run.set1_inner);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a4b1eb);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,run.set1_inner + 1);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a4b1eb);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,run.set1_outer);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a4b1eb);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,run.set1_outer + 1);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [26])"] and inner tess levels:[");
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,run.set1_outer + 2);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a4b1eb);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,run.set1_outer + 3);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [23])"], outer tess levels:[");
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,run.set2_inner);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a4b1eb);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,run.set2_inner + 1);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a4b1eb);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,run.set2_outer);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a4b1eb);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,run.set2_outer + 1);
        pMVar4 = tcu::MessageBuilder::operator<<
                           (pMVar4,(char (*) [47])"], primitive mode: triangles, vertex spacing: ");
        pMVar4 = tcu::MessageBuilder::operator<<
                           (pMVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_460);
        tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_5e0);
        pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar5,
                   "Amount of vertices generated by tessellator differs between base and references passes"
                   ,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTriangles.cpp"
                   ,0x41c);
        __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      run.set2_data.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ =
           vs_mode_string.field_2._12_4_;
      TessellationShaderUtils::getDataGeneratedByTessellator
                (&local_5f8,this->m_utils,(float *)&n_set2_vertices,false,
                 TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES,
                 TESSELLATION_SHADER_VERTEX_ORDERING_CCW,
                 (_tessellation_shader_vertex_spacing)run.set2_outer[2],run.set1_inner);
      std::vector<char,_std::allocator<char>_>::operator=
                ((vector<char,_std::allocator<char>_> *)&run.vertex_spacing,&local_5f8);
      std::vector<char,_std::allocator<char>_>::~vector(&local_5f8);
      TessellationShaderUtils::getDataGeneratedByTessellator
                (&local_610,this->m_utils,run.set1_outer + 2,false,
                 TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES,
                 TESSELLATION_SHADER_VERTEX_ORDERING_CCW,
                 (_tessellation_shader_vertex_spacing)run.set2_outer[2],run.set2_inner);
      std::vector<char,_std::allocator<char>_>::operator=
                ((vector<char,_std::allocator<char>_> *)
                 &run.set1_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                 &local_610);
      std::vector<char,_std::allocator<char>_>::~vector(&local_610);
      std::
      vector<glcts::TessellationShaderTrianglesInnerTessellationLevelRounding::_run,_std::allocator<glcts::TessellationShaderTrianglesInnerTessellationLevelRounding::_run>_>
      ::push_back(&this->m_runs,(value_type *)&n_set2_vertices);
      _run::~_run((_run *)&n_set2_vertices);
    }
    n_tess_level = n_tess_level + 1;
  } while( true );
}

Assistant:

void TessellationShaderTrianglesInnerTessellationLevelRounding::runTestIterations()
{
	/* Skip if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Initialize Utils instance */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_utils = new TessellationShaderUtils(gl, this);

	/* Retrieve GL_MAX_TESS_GEN_LEVEL_EXT value */
	glw::GLint gl_max_tess_gen_level_value = 0;

	gl.getIntegerv(m_glExtTokens.MAX_TESS_GEN_LEVEL, &gl_max_tess_gen_level_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call failed for GL_MAX_TESS_GEN_LEVEL_EXT pname");

	/* Initialize all test runs */
	const glw::GLint   tess_levels[] = { 2, gl_max_tess_gen_level_value / 2, gl_max_tess_gen_level_value };
	const unsigned int n_tess_levels = sizeof(tess_levels) / sizeof(tess_levels[0]);

	const _tessellation_shader_vertex_spacing vs_modes[] = { TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,
															 TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_EVEN,
															 TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD };
	const unsigned int n_vs_modes = sizeof(vs_modes) / sizeof(vs_modes[0]);

	for (unsigned int n_vs_mode = 0; n_vs_mode < n_vs_modes; ++n_vs_mode)
	{
		_tessellation_shader_vertex_spacing vs_mode = vs_modes[n_vs_mode];

		for (unsigned int n_tess_level = 0; n_tess_level < n_tess_levels; ++n_tess_level)
		{
			/* Set up the run descriptor */
			glw::GLint tess_level = tess_levels[n_tess_level];
			_run	   run;

			run.set1_inner[0] = 1.0f;
			run.set1_inner[1] = 0.0f;
			run.set2_inner[1] = 0.0f;

			TessellationShaderUtils::getTessellationLevelAfterVertexSpacing(vs_mode, 1.5f, gl_max_tess_gen_level_value,
																			DE_NULL, /* out_clamped */
																			run.set2_inner);
			run.set1_outer[0] = (glw::GLfloat)tess_level;
			run.set2_outer[0] = (glw::GLfloat)tess_level;
			run.set1_outer[1] = (glw::GLfloat)tess_level;
			run.set2_outer[1] = (glw::GLfloat)tess_level;
			run.set1_outer[2] = (glw::GLfloat)tess_level;
			run.set2_outer[2] = (glw::GLfloat)tess_level;
			run.set1_outer[3] = (glw::GLfloat)tess_level;
			run.set2_outer[3] = (glw::GLfloat)tess_level;

			run.vertex_spacing = vs_mode;

			/* Retrieve vertex data for both passes */
			glw::GLint n_set1_vertices = 0;
			glw::GLint n_set2_vertices = 0;

			n_set1_vertices = m_utils->getAmountOfVerticesGeneratedByTessellator(
				TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES, run.set1_inner, run.set1_outer, run.vertex_spacing,
				false); /* is_point_mode_enabled */
			n_set2_vertices = m_utils->getAmountOfVerticesGeneratedByTessellator(
				TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES, run.set2_inner, run.set2_outer, run.vertex_spacing,
				false); /* is_point_mode_enabled */

			if (n_set1_vertices == 0)
			{
				std::string vs_mode_string = TessellationShaderUtils::getESTokenForVertexSpacingMode(vs_mode);

				m_testCtx.getLog() << tcu::TestLog::Message << "No vertices were generated by tessellator for: "
															   "inner tess levels:"
															   "["
								   << run.set1_inner[0] << ", " << run.set1_inner[1] << "]"
																						", outer tess levels:"
																						"["
								   << run.set1_outer[0] << ", " << run.set1_outer[1] << ", " << run.set1_outer[2]
								   << ", " << run.set1_outer[3] << "]"
																   ", primitive mode: triangles, "
																   "vertex spacing: "
								   << vs_mode_string << tcu::TestLog::EndMessage;

				TCU_FAIL("Zero vertices were generated by tessellator for first test pass");
			}

			if (n_set2_vertices == 0)
			{
				std::string vs_mode_string = TessellationShaderUtils::getESTokenForVertexSpacingMode(vs_mode);

				m_testCtx.getLog() << tcu::TestLog::Message << "No vertices were generated by tessellator for: "
															   "inner tess levels:"
															   "["
								   << run.set2_inner[0] << ", " << run.set2_inner[1] << "]"
																						", outer tess levels:"
																						"["
								   << run.set2_outer[0] << ", " << run.set2_outer[1] << ", " << run.set2_outer[2]
								   << ", " << run.set2_outer[3] << "]"
																   ", primitive mode: triangles, "
																   "vertex spacing: "
								   << vs_mode_string << tcu::TestLog::EndMessage;

				TCU_FAIL("Zero vertices were generated by tessellator for second test pass");
			}

			if (n_set1_vertices != n_set2_vertices)
			{
				std::string vs_mode_string = TessellationShaderUtils::getESTokenForVertexSpacingMode(vs_mode);

				m_testCtx.getLog() << tcu::TestLog::Message << "Amount of vertices generated by the tessellator differs"
															   " for the following inner/outer configs: "
															   "inner tess levels:"
															   "["
								   << run.set1_inner[0] << ", " << run.set1_inner[1] << "]"
																						", outer tess levels:"
																						"["
								   << run.set1_outer[0] << ", " << run.set1_outer[1] << ", " << run.set1_outer[2]
								   << ", " << run.set1_outer[3] << "]"
																   " and inner tess levels:"
																   "["
								   << run.set2_inner[0] << ", " << run.set2_inner[1] << "]"
																						", outer tess levels:"
																						"["
								   << run.set2_outer[0] << ", " << run.set2_outer[1] << ", " << run.set2_outer[2]
								   << ", " << run.set2_outer[3] << "]"
																   ", primitive mode: triangles, vertex spacing: "
								   << vs_mode_string << tcu::TestLog::EndMessage;

				TCU_FAIL("Amount of vertices generated by tessellator differs between base and references passes");
			}

			run.n_vertices = n_set1_vertices;

			run.set1_data = m_utils->getDataGeneratedByTessellator(run.set1_inner, false, /* is_point_mode_enabled */
																   TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES,
																   TESSELLATION_SHADER_VERTEX_ORDERING_CCW,
																   run.vertex_spacing, run.set1_outer);
			run.set2_data = m_utils->getDataGeneratedByTessellator(run.set2_inner, false, /* is_point_mode_enabled */
																   TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES,
																   TESSELLATION_SHADER_VERTEX_ORDERING_CCW,
																   run.vertex_spacing, run.set2_outer);

			/* Store the run data */
			m_runs.push_back(run);
		} /* for (all sets) */
	}	 /* for (all vertex spacing modes) */
}